

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

nbt_node * nbt_clone(nbt_node *tree)

{
  long lVar1;
  nbt_node *__ptr;
  int *piVar2;
  char *pcVar3;
  uchar *puVar4;
  nbt_list *pnVar5;
  int32_t *newbuf_1;
  uchar *newbuf;
  nbt_node *ret;
  nbt_node *tree_local;
  
  if (tree == (nbt_node *)0x0) {
    return (nbt_node *)0x0;
  }
  if (tree->type == TAG_INVALID) {
    __assert_fail("tree->type != TAG_INVALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x85,"nbt_node *nbt_clone(nbt_node *)");
  }
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = -2;
    return (nbt_node *)0x0;
  }
  __ptr->type = tree->type;
  pcVar3 = safe_strdup(tree->name);
  __ptr->name = pcVar3;
  if ((tree->name != (char *)0x0) && (__ptr->name == (char *)0x0)) goto LAB_001054b8;
  if (tree->type == TAG_STRING) {
    pcVar3 = _nbt_strdup((tree->payload).tag_string);
    (__ptr->payload).tag_string = pcVar3;
    lVar1 = (__ptr->payload).tag_long;
  }
  else {
    if (tree->type == TAG_BYTE_ARRAY) {
      puVar4 = (uchar *)malloc((long)(tree->payload).tag_byte_array.length);
      if (puVar4 != (uchar *)0x0) {
        memcpy(puVar4,(tree->payload).tag_byte_array.data,
               (long)(tree->payload).tag_byte_array.length);
        (__ptr->payload).tag_byte_array.data = puVar4;
        (__ptr->payload).tag_byte_array.length = (tree->payload).tag_byte_array.length;
        return __ptr;
      }
      piVar2 = __errno_location();
      *piVar2 = -2;
      goto LAB_001054b8;
    }
    if (tree->type == TAG_INT_ARRAY) {
      puVar4 = (uchar *)malloc((long)(tree->payload).tag_byte_array.length << 2);
      if (puVar4 != (uchar *)0x0) {
        memcpy(puVar4,(tree->payload).tag_byte_array.data,
               (long)(tree->payload).tag_byte_array.length);
        (__ptr->payload).tag_byte_array.data = puVar4;
        (__ptr->payload).tag_byte_array.length = (tree->payload).tag_byte_array.length;
        return __ptr;
      }
      piVar2 = __errno_location();
      *piVar2 = -2;
      goto LAB_001054b8;
    }
    if (tree->type == TAG_LIST) {
      pnVar5 = clone_list((tree->payload).tag_list);
      (__ptr->payload).tag_list = pnVar5;
      lVar1 = (__ptr->payload).tag_long;
    }
    else {
      if (tree->type != TAG_COMPOUND) {
        (__ptr->payload).tag_long = (tree->payload).tag_long;
        *(undefined8 *)((long)&__ptr->payload + 8) = *(undefined8 *)((long)&tree->payload + 8);
        return __ptr;
      }
      pnVar5 = clone_list((tree->payload).tag_list);
      (__ptr->payload).tag_list = pnVar5;
      lVar1 = (__ptr->payload).tag_long;
    }
  }
  if (lVar1 != 0) {
    return __ptr;
  }
LAB_001054b8:
  if (__ptr != (nbt_node *)0x0) {
    free(__ptr->name);
  }
  free(__ptr);
  return (nbt_node *)0x0;
}

Assistant:

nbt_node* nbt_clone(nbt_node* tree)
{
    if(tree == NULL) return NULL;
    assert(tree->type != TAG_INVALID);

    nbt_node* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, return NULL);

    ret->type = tree->type;
    ret->name = safe_strdup(tree->name);

    if(tree->name && ret->name == NULL) goto clone_error;

    if(tree->type == TAG_STRING)
    {
        ret->payload.tag_string = _nbt_strdup(tree->payload.tag_string);
        if(ret->payload.tag_string == NULL) goto clone_error;
    }

    else if(tree->type == TAG_BYTE_ARRAY)
    {
        unsigned char* newbuf;
        CHECKED_MALLOC(newbuf, tree->payload.tag_byte_array.length, goto clone_error);

        memcpy(newbuf,
               tree->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.length);

        ret->payload.tag_byte_array.data   = newbuf;
        ret->payload.tag_byte_array.length = tree->payload.tag_byte_array.length;
    }

    else if(tree->type == TAG_INT_ARRAY)
    {
        int32_t* newbuf;
        CHECKED_MALLOC(newbuf, tree->payload.tag_int_array.length * sizeof(int32_t), goto clone_error);

        memcpy(newbuf,
               tree->payload.tag_int_array.data,
               tree->payload.tag_int_array.length);

        ret->payload.tag_int_array.data   = newbuf;
        ret->payload.tag_int_array.length = tree->payload.tag_int_array.length;
    }

    else if(tree->type == TAG_LIST)
    {
        ret->payload.tag_list = clone_list(tree->payload.tag_list);
        if(ret->payload.tag_list == NULL) goto clone_error;
    }
    else if(tree->type == TAG_COMPOUND)
    {
        ret->payload.tag_compound = clone_list(tree->payload.tag_compound);
        if(ret->payload.tag_compound == NULL) goto clone_error;
    }
    else
    {
        ret->payload = tree->payload;
    }

    return ret;

clone_error:
    if(ret) free(ret->name);

    free(ret);
    return NULL;
}